

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

bool __thiscall QTextStreamPrivate::getChar(QTextStreamPrivate *this,QChar *ch)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QChar *pQVar4;
  QTextStreamPrivate *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *in_stack_00000048;
  qint64 in_stack_000000a0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool local_b;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI[4] != 0) &&
      (lVar1 = in_RDI[5], qVar3 = QString::size((QString *)in_RDI[4]), lVar1 == qVar3)) ||
     ((*in_RDI != 0 &&
      ((bVar2 = QString::isEmpty((QString *)0x4aea31), bVar2 &&
       (bVar2 = fillReadBuffer(in_stack_00000048,in_stack_000000a0), !bVar2)))))) {
    if (in_RSI != (QTextStreamPrivate *)0x0) {
      QChar::QChar(&local_a);
      *(char16_t *)&in_RSI->device = local_a.ucs;
    }
    local_b = false;
  }
  else {
    if (in_RSI != (QTextStreamPrivate *)0x0) {
      pQVar4 = readPtr((QTextStreamPrivate *)
                       CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      *(char16_t *)&in_RSI->device = pQVar4->ucs;
    }
    consume(in_RSI,(qsizetype)in_RDI);
    local_b = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b;
}

Assistant:

inline bool QTextStreamPrivate::getChar(QChar *ch)
{
    if ((string && stringOffset == string->size())
        || (device && readBuffer.isEmpty() && !fillReadBuffer())) {
        if (ch)
            *ch = QChar();
        return false;
    }
    if (ch)
        *ch = *readPtr();
    consume(1);
    return true;
}